

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Primitive.cpp
# Opt level: O0

void __thiscall Primitive::Primitive(Primitive *this)

{
  int iVar1;
  undefined8 *in_RDI;
  Vector3 local_30 [2];
  
  *in_RDI = &PTR_getColor_0014d7f0;
  Vector3::Vector3((Vector3 *)(in_RDI + 1),0.0);
  Vector3::Vector3((Vector3 *)(in_RDI + 4),0.0);
  Picture::Picture((Picture *)(in_RDI + 0xd));
  iVar1 = rand();
  *(int *)(in_RDI + 7) = iVar1;
  Vector3::Vector3(local_30,0.0);
  in_RDI[4] = local_30[0].x;
  in_RDI[5] = local_30[0].y;
  in_RDI[6] = local_30[0].z;
  in_RDI[1] = in_RDI[4];
  in_RDI[2] = in_RDI[5];
  in_RDI[3] = in_RDI[6];
  Vector3::~Vector3(local_30);
  in_RDI[0xb] = 0;
  in_RDI[10] = 0;
  in_RDI[9] = 0;
  in_RDI[8] = 0;
  in_RDI[0xc] = 0;
  iVar1 = cnt + 1;
  *(int *)((long)in_RDI + 0x3c) = cnt;
  cnt = iVar1;
  return;
}

Assistant:

Primitive::Primitive() {
    hashId = rand();
    color = absor = Color();
    refl = refr = diff = spec = 0;
    rindex = 0;
    id = cnt++;
}